

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_41511::rejectBStringMixedCase(anon_unknown_dwarf_41511 *this,string *bstring)

{
  anon_unknown_dwarf_41511 *paVar1;
  int iVar2;
  runtime_error *this_00;
  anon_unknown_dwarf_41511 *paVar3;
  anon_unknown_dwarf_41511 *paVar4;
  anon_unknown_dwarf_41511 *paVar5;
  long lVar6;
  long lVar7;
  
  paVar1 = this + (long)bstring;
  lVar6 = (long)bstring >> 2;
  paVar4 = this;
  if (0 < lVar6) {
    paVar4 = this + ((ulong)bstring & 0xfffffffffffffffc);
    lVar7 = lVar6 + 1;
    paVar5 = this + 3;
    do {
      iVar2 = isupper((int)(char)paVar5[-3]);
      if (iVar2 != 0) {
        paVar5 = paVar5 + -3;
        goto LAB_0011b164;
      }
      iVar2 = isupper((int)(char)paVar5[-2]);
      if (iVar2 != 0) {
        paVar5 = paVar5 + -2;
        goto LAB_0011b164;
      }
      iVar2 = isupper((int)(char)paVar5[-1]);
      if (iVar2 != 0) {
        paVar5 = paVar5 + -1;
        goto LAB_0011b164;
      }
      iVar2 = isupper((int)(char)*paVar5);
      if (iVar2 != 0) goto LAB_0011b164;
      lVar7 = lVar7 + -1;
      paVar5 = paVar5 + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)paVar1 - (long)paVar4;
  if (lVar7 == 1) {
LAB_0011b13d:
    iVar2 = isupper((int)(char)*paVar4);
    paVar5 = paVar4;
    if (iVar2 == 0) {
      paVar5 = paVar1;
    }
  }
  else if (lVar7 == 2) {
LAB_0011b12d:
    iVar2 = isupper((int)(char)*paVar4);
    paVar5 = paVar4;
    if (iVar2 == 0) {
      paVar4 = paVar4 + 1;
      goto LAB_0011b13d;
    }
  }
  else {
    paVar5 = paVar1;
    if ((lVar7 == 3) && (iVar2 = isupper((int)(char)*paVar4), paVar5 = paVar4, iVar2 == 0)) {
      paVar4 = paVar4 + 1;
      goto LAB_0011b12d;
    }
  }
LAB_0011b164:
  paVar4 = this;
  if (0 < lVar6) {
    paVar4 = this + ((ulong)bstring & 0xfffffffffffffffc);
    lVar6 = lVar6 + 1;
    paVar3 = this + 3;
    do {
      iVar2 = islower((int)(char)paVar3[-3]);
      if (iVar2 != 0) {
        paVar3 = paVar3 + -3;
        goto LAB_0011b20f;
      }
      iVar2 = islower((int)(char)paVar3[-2]);
      if (iVar2 != 0) {
        paVar3 = paVar3 + -2;
        goto LAB_0011b20f;
      }
      iVar2 = islower((int)(char)paVar3[-1]);
      if (iVar2 != 0) {
        paVar3 = paVar3 + -1;
        goto LAB_0011b20f;
      }
      iVar2 = islower((int)(char)*paVar3);
      if (iVar2 != 0) goto LAB_0011b20f;
      lVar6 = lVar6 + -1;
      paVar3 = paVar3 + 4;
    } while (1 < lVar6);
  }
  lVar6 = (long)paVar1 - (long)paVar4;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      if (lVar6 != 3) {
        return;
      }
      iVar2 = islower((int)(char)*paVar4);
      paVar3 = paVar4;
      if (iVar2 != 0) goto LAB_0011b20f;
      paVar4 = paVar4 + 1;
    }
    iVar2 = islower((int)(char)*paVar4);
    paVar3 = paVar4;
    if (iVar2 != 0) goto LAB_0011b20f;
    paVar4 = paVar4 + 1;
  }
  iVar2 = islower((int)(char)*paVar4);
  paVar3 = paVar4;
  if (iVar2 == 0) {
    paVar3 = paVar1;
  }
LAB_0011b20f:
  if ((paVar5 != paVar1) && (paVar3 != paVar1)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"bech32 string is mixed case");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void rejectBStringMixedCase(const std::string &bstring) {
        bool atLeastOneUpper = std::any_of(bstring.begin(), bstring.end(), &::isupper);
        bool atLeastOneLower = std::any_of(bstring.begin(), bstring.end(), &::islower);
        if(atLeastOneUpper && atLeastOneLower) {
            throw std::runtime_error("bech32 string is mixed case");
        }
    }